

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

Gia_Man_t * Gia_ManPerformMapping(Gia_Man_t *p,void *pp)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pGVar3;
  
  if ((((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) ||
      (iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar1 == 0)) ||
     (iVar1 = Gia_ManIsNormalized(p), iVar1 == 0)) {
    pGVar3 = Gia_ManPerformMappingInt(p,(If_Par_t *)pp);
    Gia_ManTransferTiming(pGVar3,p);
    pGVar2 = pGVar3;
    if (*(int *)((long)pp + 0xa8) != 0) {
      pGVar2 = Gia_ManDupHashMapping(pGVar3);
      Gia_ManTransferPacking(pGVar2,pGVar3);
      Gia_ManTransferTiming(pGVar2,pGVar3);
      Gia_ManStop(pGVar3);
    }
  }
  else {
    pGVar2 = Gia_ManDupUnnormalize(p);
    if (pGVar2 == (Gia_Man_t *)0x0) {
      return (Gia_Man_t *)0x0;
    }
    Gia_ManTransferTiming(pGVar2,p);
    pGVar3 = Gia_ManPerformMappingInt(pGVar2,(If_Par_t *)pp);
    if (pGVar3 != pGVar2) {
      Gia_ManTransferTiming(pGVar3,pGVar2);
      Gia_ManStop(pGVar2);
    }
    pGVar2 = Gia_ManDupNormalize(pGVar3,*(int *)((long)pp + 0xa8));
    Gia_ManTransferMapping(pGVar2,pGVar3);
    Gia_ManTransferPacking(pGVar2,pGVar3);
    Gia_ManTransferTiming(pGVar2,pGVar3);
    Gia_ManStop(pGVar3);
    iVar1 = Gia_ManIsNormalized(pGVar2);
    if (iVar1 == 0) {
      __assert_fail("Gia_ManIsNormalized(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x95a,"Gia_Man_t *Gia_ManPerformMapping(Gia_Man_t *, void *)");
    }
  }
  pGVar2->MappedDelay = (int)*(float *)((long)pp + 0x100);
  pGVar2->MappedArea = (int)*(float *)((long)pp + 0x104);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManPerformMapping( Gia_Man_t * p, void * pp )
{
    Gia_Man_t * pNew;
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) && Gia_ManIsNormalized(p) )
    {
        pNew = Gia_ManDupUnnormalize( p );
        if ( pNew == NULL )
            return NULL;
        Gia_ManTransferTiming( pNew, p );
        p = pNew;
        // mapping
        pNew = Gia_ManPerformMappingInt( p, (If_Par_t *)pp );
        if ( pNew != p )
        {
            Gia_ManTransferTiming( pNew, p );
            Gia_ManStop( p );
        }
        // normalize
        pNew = Gia_ManDupNormalize( p = pNew, ((If_Par_t *)pp)->fHashMapping );
        Gia_ManTransferMapping( pNew, p );
        Gia_ManTransferPacking( pNew, p );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
        assert( Gia_ManIsNormalized(pNew) );
    }
    else 
    {
        pNew = Gia_ManPerformMappingInt( p, (If_Par_t *)pp );
        Gia_ManTransferTiming( pNew, p );
        if ( ((If_Par_t *)pp)->fHashMapping )
        {
            pNew = Gia_ManDupHashMapping( p = pNew );
            Gia_ManTransferPacking( pNew, p );
            Gia_ManTransferTiming( pNew, p );
            Gia_ManStop( p );
        }
    }
    pNew->MappedDelay = (int)((If_Par_t *)pp)->FinalDelay;
    pNew->MappedArea  = (int)((If_Par_t *)pp)->FinalArea;
    return pNew;
}